

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cvc.c
# Opt level: O0

err_t cmdCVCsCreate(octet *certs,size_t *certs_len,char *descr)

{
  err_t eVar1;
  size_t sVar2;
  char ***in_RDX;
  ulong *in_RSI;
  long in_RDI;
  size_t size;
  size_t len;
  int pos;
  char **argv;
  int argc;
  err_t code;
  ulong local_40;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar3;
  size_t *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  err_t local_4;
  
  local_4 = cmdArgCreate((int *)in_RSI,in_RDX,
                         (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (local_4 == 0) {
    local_40 = 0;
    for (iVar3 = 0; iVar3 < (int)in_stack_ffffffffffffffd8; iVar3 = iVar3 + 1) {
      sVar2 = cmdFileSize((char *)CONCAT44(local_4,in_stack_ffffffffffffffd8));
      eVar1 = 0xcf;
      if (sVar2 != 0xffffffffffffffff) {
        eVar1 = 0;
      }
      if (eVar1 != 0) {
        cmdArgClose((char **)0x1044ec);
        return eVar1;
      }
      local_4 = 0;
      if (in_RDI != 0) {
        eVar1 = 0x6e;
        if (local_40 + sVar2 <= *in_RSI) {
          eVar1 = 0;
        }
        if (eVar1 != 0) {
          cmdArgClose((char **)0x104534);
          return eVar1;
        }
        local_4 = cmdFileReadAll((void *)(ulong)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                                 (char *)CONCAT44(iVar3,in_stack_ffffffffffffffc8));
        if (local_4 != 0) {
          cmdArgClose((char **)0x104573);
          return local_4;
        }
      }
      local_40 = sVar2 + local_40;
    }
    cmdArgClose((char **)0x1045a7);
    *in_RSI = local_40;
  }
  return local_4;
}

Assistant:

err_t cmdCVCsCreate(octet* certs, size_t* certs_len, const char* descr)
{
	err_t code;
	int argc;
	char** argv;
	int pos;
	size_t len;
	// pre
	ASSERT(memIsValid(certs_len, O_PER_S));
	ASSERT(memIsNullOrValid(certs, *certs_len));
	ASSERT(strIsValid(descr));
	// создать список файлов сертификатов
	code = cmdArgCreate(&argc, &argv, descr);
	ERR_CALL_CHECK(code);
	// просмотреть список
	len = 0;
	for (pos = 0; pos < argc; ++pos)
	{
		size_t size;
		// определить размер файла
		size = cmdFileSize(argv[pos]);
		code = size != SIZE_MAX ? ERR_OK : ERR_FILE_READ;
		ERR_CALL_HANDLE(code, cmdArgClose(argv));
		// режим чтения?
		if (certs)
		{
			// выход за границы?
			code = len + size <= *certs_len ? ERR_OK : ERR_OUTOFMEMORY;
			ERR_CALL_HANDLE(code, cmdArgClose(argv));
			// читать сертификат
			code = cmdFileReadAll(certs + len, &size, argv[pos]);
			ERR_CALL_HANDLE(code, cmdArgClose(argv));
		}
		// увеличить длину коллекции
		len += size;
	}
	cmdArgClose(argv);
	// завершить
	*certs_len = len;
	return code;
}